

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Context> minja::Context::builtins(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  long lVar1;
  shared_ptr<minja::Context> sVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  anon_class_1_1_50aec549 select_or_reject;
  allocator_type local_28b;
  allocator_type local_28a;
  anon_class_1_0_00000001 char_transform_function;
  anon_class_1_0_00000001 select_or_reject_attr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  undefined1 local_228 [64];
  string local_1e8 [32];
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  string local_1a8 [61];
  allocator_type local_16b;
  allocator<char> local_16a;
  allocator<char> local_169;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  Value equalto;
  Value escape;
  Value globals;
  shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>_>
  local_28;
  
  std::
  make_shared<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,minja::Value,std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::allocator<std::pair<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const,minja::Value>>>>
            ();
  Value::Value(&globals,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.
              super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Value::Value((Value *)local_228,"raise_exception");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equalto,"raise_exception",(allocator<char> *)local_248._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"message",(allocator<char> *)&local_260);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&select_or_reject_attr,__l,(allocator_type *)&char_transform_function);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2588:84)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2588:84)>
              ::_M_manager;
  simple_function(&escape,(string *)&equalto,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&select_or_reject_attr,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_168);
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value(&escape);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_1c8._M_pod_data);
  std::__cxx11::string::~string((string *)&equalto);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"tojson");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"tojson",(allocator<char> *)local_248._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equalto,"value",(allocator<char> *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equalto.object_,"indent",(allocator<char> *)&char_transform_function);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&equalto;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&select_or_reject_attr,__l_00,(allocator_type *)&select_or_reject);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2591:74)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2591:74)>
              ::_M_manager;
  simple_function(&escape,(string *)&local_1c8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&select_or_reject_attr,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_168);
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value(&escape);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&select_or_reject_attr);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&equalto.super_enable_shared_from_this<minja::Value>._M_weak_this.
                       super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)local_1c8._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"items");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equalto,"items",(allocator<char> *)local_248._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"object",(allocator<char> *)&local_260);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&select_or_reject_attr,__l_01,(allocator_type *)&char_transform_function);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2594:63)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2594:63)>
              ::_M_manager;
  simple_function(&escape,(string *)&equalto,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&select_or_reject_attr,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_168);
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value(&escape);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_1c8._M_pod_data);
  std::__cxx11::string::~string((string *)&equalto);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"last");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equalto,"last",(allocator<char> *)local_248._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"items",(allocator<char> *)&local_260);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&select_or_reject_attr,__l_02,(allocator_type *)&char_transform_function);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2611:60)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2611:60)>
              ::_M_manager;
  simple_function(&escape,(string *)&equalto,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&select_or_reject_attr,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_168);
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value(&escape);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_1c8._M_pod_data);
  std::__cxx11::string::~string((string *)&equalto);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"trim");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equalto,"trim",(allocator<char> *)local_248._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"text",(allocator<char> *)&local_260);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&select_or_reject_attr,__l_03,(allocator_type *)&char_transform_function);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2617:59)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2617:59)>
              ::_M_manager;
  simple_function(&escape,(string *)&equalto,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&select_or_reject_attr,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_168);
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value(&escape);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_1c8._M_pod_data);
  std::__cxx11::string::~string((string *)&equalto);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"lower");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equalto,"lower",(allocator<char> *)local_168._M_pod_data);
  local_1c8._8_8_ = 0;
  local_1c8._M_unused._M_function_pointer = tolower;
  local_1b0 = std::_Function_handler<char_(char),_int_(*)(int)_noexcept>::_M_invoke;
  local_1b8 = std::_Function_handler<char_(char),_int_(*)(int)_noexcept>::_M_manager;
  builtins::anon_class_1_0_00000001::operator()
            (&escape,&char_transform_function,(string *)&equalto,(function<char_(char)> *)&local_1c8
            );
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value(&escape);
  std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
  std::__cxx11::string::~string((string *)&equalto);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"upper");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equalto,"upper",(allocator<char> *)local_168._M_pod_data);
  local_1c8._8_8_ = 0;
  local_1c8._M_unused._M_function_pointer = toupper;
  local_1b0 = std::_Function_handler<char_(char),_int_(*)(int)_noexcept>::_M_invoke;
  local_1b8 = std::_Function_handler<char_(char),_int_(*)(int)_noexcept>::_M_manager;
  builtins::anon_class_1_0_00000001::operator()
            (&escape,&char_transform_function,(string *)&equalto,(function<char_(char)> *)&local_1c8
            );
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value(&escape);
  std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
  std::__cxx11::string::~string((string *)&equalto);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"default");
  equalto.super_enable_shared_from_this<minja::Value>._M_weak_this.
  super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  equalto.super_enable_shared_from_this<minja::Value>._M_weak_this.
  super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  equalto.array_.
  super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2633:42)>
       ::_M_invoke;
  equalto.array_.
  super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            std::
            _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2633:42)>
            ::_M_manager;
  Value::callable(&escape,(CallableType *)&equalto);
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value(&escape);
  std::_Function_base::~_Function_base((_Function_base *)&equalto);
  Value::~Value((Value *)local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_228,"escape",(allocator<char> *)&select_or_reject_attr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equalto,"text",(allocator<char> *)local_248._M_pod_data);
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&equalto;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_168,__l_04,(allocator_type *)&local_260);
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_1b0 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2648:55)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2648:55)>
              ::_M_manager;
  simple_function(&escape,(string *)local_228,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_168,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_168);
  std::__cxx11::string::~string((string *)&equalto);
  std::__cxx11::string::~string((string *)local_228);
  Value::Value((Value *)local_228,"e");
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"escape");
  Value::set(&globals,(Value *)local_228,&escape);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"joiner");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"joiner",(allocator<char> *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"sep",(allocator<char> *)&select_or_reject);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_248,__l_05,&local_28b);
  _select_or_reject_attr = (void *)0x0;
  simple_function(&equalto,(string *)&local_1c8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_248,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&select_or_reject_attr);
  Value::set(&globals,(Value *)local_228,&equalto);
  Value::~Value(&equalto);
  std::_Function_base::~_Function_base((_Function_base *)&select_or_reject_attr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_248);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  std::__cxx11::string::~string((string *)local_1c8._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"count");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"count",(allocator<char> *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"items",(allocator<char> *)&select_or_reject);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_248,__l_06,&local_28b);
  _select_or_reject_attr = (void *)0x0;
  simple_function(&equalto,(string *)&local_1c8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_248,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&select_or_reject_attr);
  Value::set(&globals,(Value *)local_228,&equalto);
  Value::~Value(&equalto);
  std::_Function_base::~_Function_base((_Function_base *)&select_or_reject_attr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_248);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  std::__cxx11::string::~string((string *)local_1c8._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"dictsort");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"dictsort",(allocator<char> *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"value",(allocator<char> *)&select_or_reject);
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_248,__l_07,&local_28b);
  _select_or_reject_attr = (void *)0x0;
  simple_function(&equalto,(string *)&local_1c8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_248,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&select_or_reject_attr);
  Value::set(&globals,(Value *)local_228,&equalto);
  Value::~Value(&equalto);
  std::_Function_base::~_Function_base((_Function_base *)&select_or_reject_attr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_248);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  std::__cxx11::string::~string((string *)local_1c8._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"join");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"join",(allocator<char> *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"items",(allocator<char> *)&select_or_reject);
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"d",(allocator<char> *)&local_28b);
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_248,__l_08,&local_28a);
  _select_or_reject_attr = (void *)0x0;
  simple_function(&equalto,(string *)&local_168,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_248,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&select_or_reject_attr);
  Value::set(&globals,(Value *)local_228,&equalto);
  Value::~Value(&equalto);
  std::_Function_base::~_Function_base((_Function_base *)&select_or_reject_attr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_248);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1c8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"namespace");
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_1b0 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2703:44)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2703:44)>
              ::_M_manager;
  Value::callable(&equalto,(CallableType *)&local_1c8);
  Value::set(&globals,(Value *)local_228,&equalto);
  Value::~Value(&equalto);
  std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
  Value::~Value((Value *)local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8._M_pod_data,"equalto",(allocator<char> *)local_248._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_228,"expected",(allocator<char> *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_228 + 0x20),"actual",(allocator<char> *)&select_or_reject);
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)local_228;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&select_or_reject_attr,__l_09,&local_28b);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2711:71)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2711:71)>
              ::_M_manager;
  simple_function(&equalto,(string *)&local_1c8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&select_or_reject_attr,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&select_or_reject_attr);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_228 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)local_1c8._M_pod_data);
  Value::Value((Value *)local_228,"equalto");
  Value::set(&globals,(Value *)local_228,&equalto);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"==");
  Value::set(&globals,(Value *)local_228,&equalto);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"length");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"length",(allocator<char> *)&select_or_reject);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&select_or_reject_attr,"items",(allocator<char> *)&local_28b);
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)&select_or_reject_attr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_260,__l_10,&local_28a);
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2716:64)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2716:64)>
              ::_M_manager;
  simple_function((Value *)&local_1c8,(string *)&local_168,&local_260,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_248);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  std::__cxx11::string::~string((string *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"safe");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"safe",(allocator<char> *)&select_or_reject);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&select_or_reject_attr,"value",(allocator<char> *)&local_28b);
  __l_11._M_len = 1;
  __l_11._M_array = (iterator)&select_or_reject_attr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_260,__l_11,&local_28a);
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2720:60)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2720:60)>
              ::_M_manager;
  simple_function((Value *)&local_1c8,(string *)&local_168,&local_260,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_248);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  std::__cxx11::string::~string((string *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"string");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"string",(allocator<char> *)&select_or_reject);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&select_or_reject_attr,"value",(allocator<char> *)&local_28b);
  __l_12._M_len = 1;
  __l_12._M_array = (iterator)&select_or_reject_attr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_260,__l_12,&local_28a);
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2723:64)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2723:64)>
              ::_M_manager;
  simple_function((Value *)&local_1c8,(string *)&local_168,&local_260,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_248);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  std::__cxx11::string::~string((string *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"int");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"int",(allocator<char> *)&select_or_reject);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&select_or_reject_attr,"value",(allocator<char> *)&local_28b);
  __l_13._M_len = 1;
  __l_13._M_array = (iterator)&select_or_reject_attr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_260,__l_13,&local_28a);
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2726:58)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2726:58)>
              ::_M_manager;
  simple_function((Value *)&local_1c8,(string *)&local_168,&local_260,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_248);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  std::__cxx11::string::~string((string *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"list");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"list",(allocator<char> *)&select_or_reject);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&select_or_reject_attr,"items",(allocator<char> *)&local_28b);
  __l_14._M_len = 1;
  __l_14._M_array = (iterator)&select_or_reject_attr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_260,__l_14,&local_28a);
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2729:60)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2729:60)>
              ::_M_manager;
  simple_function((Value *)&local_1c8,(string *)&local_168,&local_260,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_248);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  std::__cxx11::string::~string((string *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"unique");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_pod_data,"unique",(allocator<char> *)&select_or_reject);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&select_or_reject_attr,"items",(allocator<char> *)&local_28b);
  __l_15._M_len = 1;
  __l_15._M_array = (iterator)&select_or_reject_attr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_260,__l_15,&local_28a);
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2734:64)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2734:64)>
              ::_M_manager;
  simple_function((Value *)&local_1c8,(string *)&local_168,&local_260,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_248);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  std::__cxx11::string::~string((string *)&select_or_reject_attr);
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"select");
  builtins::anon_class_1_1_50aec549::operator()((Value *)&local_1c8,&select_or_reject,true);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"reject");
  builtins::anon_class_1_1_50aec549::operator()((Value *)&local_1c8,&select_or_reject,false);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"map");
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2795:38)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2795:38)>
              ::_M_manager;
  Value::callable((Value *)&local_1c8,(CallableType *)&local_168);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)&local_1c8,"indent");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&select_or_reject_attr,"indent",(allocator<char> *)&local_28b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_228,"text",(allocator<char> *)&local_28a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_228 + 0x20),"indent",&local_169);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"first",&local_16a);
  __l_16._M_len = 3;
  __l_16._M_array = (iterator)local_228;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_260,__l_16,&local_16b);
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2824:82)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2824:82)>
              ::_M_manager;
  simple_function((Value *)&local_168,(string *)&select_or_reject_attr,&local_260,
                  (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
                   *)&local_248);
  Value::set(&globals,(Value *)&local_1c8,(Value *)&local_168);
  Value::~Value((Value *)&local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_228 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&select_or_reject_attr);
  Value::~Value((Value *)&local_1c8);
  Value::Value((Value *)local_228,"selectattr");
  builtins::anon_class_1_0_00000001::operator()((Value *)&local_1c8,&select_or_reject_attr,true);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"rejectattr");
  builtins::anon_class_1_0_00000001::operator()((Value *)&local_1c8,&select_or_reject_attr,false);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  Value::~Value((Value *)local_228);
  Value::Value((Value *)local_228,"range");
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2882:40)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/minja/minja.hpp:2882:40)>
              ::_M_manager;
  Value::callable((Value *)&local_1c8,(CallableType *)&local_168);
  Value::set(&globals,(Value *)local_228,(Value *)&local_1c8);
  Value::~Value((Value *)&local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  Value::~Value((Value *)local_228);
  std::make_shared<minja::Context,minja::Value>((Value *)in_RDI);
  Value::~Value(&equalto);
  Value::~Value(&escape);
  Value::~Value(&globals);
  sVar2.super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<minja::Context>)
         sVar2.super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Context> Context::builtins() {
  auto globals = Value::object();

  globals.set("raise_exception", simple_function("raise_exception", { "message" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
    throw std::runtime_error(args.at("message").get<std::string>());
  }));
  globals.set("tojson", simple_function("tojson", { "value", "indent" }, [](const std::shared_ptr<Context> &, Value & args) {
    return Value(args.at("value").dump(args.get<int64_t>("indent", -1), /* to_json= */ true));
  }));
  globals.set("items", simple_function("items", { "object" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto items = Value::array();
    if (args.contains("object")) {
      auto & obj = args.at("object");
      if (obj.is_string()) {
        auto json_obj = json::parse(obj.get<std::string>());
        for (const auto & kv : json_obj.items()) {
          items.push_back(Value::array({kv.key(), kv.value()}));
        }
      } else if (!obj.is_null()) {
        for (auto & key : obj.keys()) {
          items.push_back(Value::array({key, obj.at(key)}));
        }
      }
    }
    return items;
  }));
  globals.set("last", simple_function("last", { "items" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto items = args.at("items");
    if (!items.is_array()) throw std::runtime_error("object is not a list");
    if (items.empty()) return Value();
    return items.at(items.size() - 1);
  }));
  globals.set("trim", simple_function("trim", { "text" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto & text = args.at("text");
    return text.is_null() ? text : Value(strip(text.get<std::string>()));
  }));
  auto char_transform_function = [](const std::string & name, const std::function<char(char)> & fn) {
    return simple_function(name, { "text" }, [=](const std::shared_ptr<Context> &, Value & args) {
      auto text = args.at("text");
      if (text.is_null()) return text;
      std::string res;
      auto str = text.get<std::string>();
      std::transform(str.begin(), str.end(), std::back_inserter(res), fn);
      return Value(res);
    });
  };
  globals.set("lower", char_transform_function("lower", ::tolower));
  globals.set("upper", char_transform_function("upper", ::toupper));
  globals.set("default", Value::callable([=](const std::shared_ptr<Context> &, ArgumentsValue & args) {
    args.expectArgs("default", {2, 3}, {0, 1});
    auto & value = args.args[0];
    auto & default_value = args.args[1];
    bool boolean = false;
    if (args.args.size() == 3) {
      boolean = args.args[2].get<bool>();
    } else {
      Value bv = args.get_named("boolean");
      if (!bv.is_null()) {
        boolean = bv.get<bool>();
      }
    }
    return boolean ? (value.to_bool() ? value : default_value) : value.is_null() ? default_value : value;
  }));
  auto escape = simple_function("escape", { "text" }, [](const std::shared_ptr<Context> &, Value & args) {
    return Value(html_escape(args.at("text").get<std::string>()));
  });
  globals.set("e", escape);
  globals.set("escape", escape);
  globals.set("joiner", simple_function("joiner", { "sep" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto sep = args.get<std::string>("sep", "");
    auto first = std::make_shared<bool>(true);
    return simple_function("", {}, [sep, first](const std::shared_ptr<Context> &, const Value &) -> Value {
      if (*first) {
        *first = false;
        return "";
      }
      return sep;
    });
    return Value(html_escape(args.at("text").get<std::string>()));
  }));
  globals.set("count", simple_function("count", { "items" }, [](const std::shared_ptr<Context> &, Value & args) {
    return Value((int64_t) args.at("items").size());
  }));
  globals.set("dictsort", simple_function("dictsort", { "value" }, [](const std::shared_ptr<Context> &, Value & args) {
    if (args.size() != 1) throw std::runtime_error("dictsort expects exactly 1 argument (TODO: fix implementation)");
    auto & value = args.at("value");
    auto keys = value.keys();
    std::sort(keys.begin(), keys.end());
    auto res = Value::array();
    for (auto & key : keys) {
      res.push_back(Value::array({key, value.at(key)}));
    }
    return res;
  }));
  globals.set("join", simple_function("join", { "items", "d" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto do_join = [](Value & items, const std::string & sep) {
      if (!items.is_array()) throw std::runtime_error("object is not iterable: " + items.dump());
      std::ostringstream oss;
      auto first = true;
      for (size_t i = 0, n = items.size(); i < n; ++i) {
        if (first) first = false;
        else oss << sep;
        oss << items.at(i).to_str();
      }
      return Value(oss.str());
    };
    auto sep = args.get<std::string>("d", "");
    if (args.contains("items")) {
        auto & items = args.at("items");
        return do_join(items, sep);
    } else {
      return simple_function("", {"items"}, [sep, do_join](const std::shared_ptr<Context> &, Value & args) {
        auto & items = args.at("items");
        if (!items.to_bool() || !items.is_array()) throw std::runtime_error("join expects an array for items, got: " + items.dump());
        return do_join(items, sep);
      });
    }
  }));
  globals.set("namespace", Value::callable([=](const std::shared_ptr<Context> &, ArgumentsValue & args) {
    auto ns = Value::object();
    args.expectArgs("namespace", {0, 0}, {0, (std::numeric_limits<size_t>::max)()});
    for (auto & [name, value] : args.kwargs) {
      ns.set(name, value);
    }
    return ns;
  }));
  auto equalto = simple_function("equalto", { "expected", "actual" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      return args.at("actual") == args.at("expected");
  });
  globals.set("equalto", equalto);
  globals.set("==", equalto);
  globals.set("length", simple_function("length", { "items" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      auto & items = args.at("items");
      return (int64_t) items.size();
  }));
  globals.set("safe", simple_function("safe", { "value" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      return args.at("value").to_str();
  }));
  globals.set("string", simple_function("string", { "value" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      return args.at("value").to_str();
  }));
  globals.set("int", simple_function("int", { "value" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      return args.at("value").to_int();
  }));
  globals.set("list", simple_function("list", { "items" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      auto & items = args.at("items");
      if (!items.is_array()) throw std::runtime_error("object is not iterable");
      return items;
  }));
  globals.set("unique", simple_function("unique", { "items" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      auto & items = args.at("items");
      if (!items.is_array()) throw std::runtime_error("object is not iterable");
      std::unordered_set<Value> seen;
      auto result = Value::array();
      for (size_t i = 0, n = items.size(); i < n; i++) {
        auto pair = seen.insert(items.at(i));
        if (pair.second) {
          result.push_back(items.at(i));
        }
      }
      return result;
  }));
  auto make_filter = [](const Value & filter, Value & extra_args) -> Value {
    return simple_function("", { "value" }, [=](const std::shared_ptr<Context> & context, Value & args) {
      auto & value = args.at("value");
      ArgumentsValue actual_args;
      actual_args.args.emplace_back(value);
      for (size_t i = 0, n = extra_args.size(); i < n; i++) {
        actual_args.args.emplace_back(extra_args.at(i));
      }
      return filter.call(context, actual_args);
    });
  };
  auto select_or_reject = [make_filter](bool is_select) {
    return Value::callable([=](const std::shared_ptr<Context> & context, ArgumentsValue & args) {
      args.expectArgs(is_select ? "select" : "reject", {2, (std::numeric_limits<size_t>::max)()}, {0, 0});
      auto & items = args.args[0];
      if (items.is_null()) {
        return Value::array();
      }
      if (!items.is_array()) {
        throw std::runtime_error("object is not iterable: " + items.dump());
      }

      auto filter_fn = context->get(args.args[1]);
      if (filter_fn.is_null()) {
        throw std::runtime_error("Undefined filter: " + args.args[1].dump());
      }

      auto filter_args = Value::array();
      for (size_t i = 2, n = args.args.size(); i < n; i++) {
        filter_args.push_back(args.args[i]);
      }
      auto filter = make_filter(filter_fn, filter_args);

      auto res = Value::array();
      for (size_t i = 0, n = items.size(); i < n; i++) {
        auto & item = items.at(i);
        ArgumentsValue filter_args;
        filter_args.args.emplace_back(item);
        auto pred_res = filter.call(context, filter_args);
        if (pred_res.to_bool() == (is_select ? true : false)) {
          res.push_back(item);
        }
      }
      return res;
    });
  };
  globals.set("select", select_or_reject(/* is_select= */ true));
  globals.set("reject", select_or_reject(/* is_select= */ false));
  globals.set("map", Value::callable([=](const std::shared_ptr<Context> & context, ArgumentsValue & args) {
    auto res = Value::array();
    if (args.args.size() == 1 &&
      ((args.has_named("attribute") && args.kwargs.size() == 1) || (args.has_named("default") && args.kwargs.size() == 2))) {
      auto & items = args.args[0];
      auto attr_name = args.get_named("attribute");
      auto default_value = args.get_named("default");
      for (size_t i = 0, n = items.size(); i < n; i++) {
        auto & item = items.at(i);
        auto attr = item.get(attr_name);
        res.push_back(attr.is_null() ? default_value : attr);
      }
    } else if (args.kwargs.empty() && args.args.size() >= 2) {
      auto fn = context->get(args.args[1]);
      if (fn.is_null()) throw std::runtime_error("Undefined filter: " + args.args[1].dump());
      ArgumentsValue filter_args { {Value()}, {} };
      for (size_t i = 2, n = args.args.size(); i < n; i++) {
        filter_args.args.emplace_back(args.args[i]);
      }
      for (size_t i = 0, n = args.args[0].size(); i < n; i++) {
        auto & item = args.args[0].at(i);
        filter_args.args[0] = item;
        res.push_back(fn.call(context, filter_args));
      }
    } else {
      throw std::runtime_error("Invalid or unsupported arguments for map");
    }
    return res;
  }));
  globals.set("indent", simple_function("indent", { "text", "indent", "first" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto text = args.at("text").get<std::string>();
    auto first = args.get<bool>("first", false);
    std::string out;
    std::string indent(args.get<int64_t>("indent", 0), ' ');
    std::istringstream iss(text);
    std::string line;
    auto is_first = true;
    while (std::getline(iss, line, '\n')) {
      auto needs_indent = !is_first || first;
      if (is_first) is_first = false;
      else out += "\n";
      if (needs_indent) out += indent;
      out += line;
    }
    if (!text.empty() && text.back() == '\n') out += "\n";
    return out;
  }));
  auto select_or_reject_attr = [](bool is_select) {
    return Value::callable([=](const std::shared_ptr<Context> & context, ArgumentsValue & args) {
      args.expectArgs(is_select ? "selectattr" : "rejectattr", {2, (std::numeric_limits<size_t>::max)()}, {0, 0});
      auto & items = args.args[0];
      if (items.is_null())
        return Value::array();
      if (!items.is_array()) throw std::runtime_error("object is not iterable: " + items.dump());
      auto attr_name = args.args[1].get<std::string>();

      bool has_test = false;
      Value test_fn;
      ArgumentsValue test_args {{Value()}, {}};
      if (args.args.size() >= 3) {
        has_test = true;
        test_fn = context->get(args.args[2]);
        if (test_fn.is_null()) throw std::runtime_error("Undefined test: " + args.args[2].dump());
        for (size_t i = 3, n = args.args.size(); i < n; i++) {
          test_args.args.emplace_back(args.args[i]);
        }
        test_args.kwargs = args.kwargs;
      }

      auto res = Value::array();
      for (size_t i = 0, n = items.size(); i < n; i++) {
        auto & item = items.at(i);
        auto attr = item.get(attr_name);
        if (has_test) {
          test_args.args[0] = attr;
          if (test_fn.call(context, test_args).to_bool() == (is_select ? true : false)) {
            res.push_back(item);
          }
        } else {
          res.push_back(attr);
        }
      }
      return res;
    });
  };
  globals.set("selectattr", select_or_reject_attr(/* is_select= */ true));
  globals.set("rejectattr", select_or_reject_attr(/* is_select= */ false));
  globals.set("range", Value::callable([=](const std::shared_ptr<Context> &, ArgumentsValue & args) {
    std::vector<int64_t> startEndStep(3);
    std::vector<bool> param_set(3);
    if (args.args.size() == 1) {
      startEndStep[1] = args.args[0].get<int64_t>();
      param_set[1] = true;
    } else {
      for (size_t i = 0; i < args.args.size(); i++) {
        auto & arg = args.args[i];
        auto v = arg.get<int64_t>();
        startEndStep[i] = v;
        param_set[i] = true;
      }
    }
    for (auto & [name, value] : args.kwargs) {
      size_t i;
      if (name == "start") {
        i = 0;
      } else if (name == "end") {
        i = 1;
      } else if (name == "step") {
        i = 2;
      } else {
        throw std::runtime_error("Unknown argument " + name + " for function range");
      }

      if (param_set[i]) {
        throw std::runtime_error("Duplicate argument " + name + " for function range");
      }
      startEndStep[i] = value.get<int64_t>();
      param_set[i] = true;
    }
    if (!param_set[1]) {
      throw std::runtime_error("Missing required argument 'end' for function range");
    }
    int64_t start = param_set[0] ? startEndStep[0] : 0;
    int64_t end = startEndStep[1];
    int64_t step = param_set[2] ? startEndStep[2] : 1;

    auto res = Value::array();
    if (step > 0) {
      for (int64_t i = start; i < end; i += step) {
        res.push_back(Value(i));
      }
    } else {
      for (int64_t i = start; i > end; i += step) {
        res.push_back(Value(i));
      }
    }
    return res;
  }));

  return std::make_shared<Context>(std::move(globals));
}